

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::UniformCollectionCase::UniformCollectionCase
          (UniformCollectionCase *this,char *name,UniformCollection *uniformCollection_)

{
  allocator<char> local_56;
  byte local_55;
  byte local_42;
  allocator<char> local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  UniformCollection *local_20;
  UniformCollection *uniformCollection__local;
  char *name_local;
  UniformCollectionCase *this_local;
  
  local_42 = 0;
  local_55 = 0;
  local_20 = uniformCollection_;
  uniformCollection__local = (UniformCollection *)name;
  name_local = (char *)this;
  if (name == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)this,"",&local_56);
    std::allocator<char>::~allocator(&local_56);
  }
  else {
    std::allocator<char>::allocator();
    local_42 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"_",&local_41);
    local_55 = 1;
    std::operator+(&this->namePrefix,name,&local_40);
  }
  if ((local_55 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_40);
  }
  if ((local_42 & 1) != 0) {
    std::allocator<char>::~allocator(&local_41);
  }
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::UniformCollection>::SharedPtr
            (&this->uniformCollection,local_20);
  return;
}

Assistant:

UniformCollectionCase (const char* const name, const UniformCollection* uniformCollection_)
		: namePrefix			(name ? name + string("_") : "")
		, uniformCollection		(uniformCollection_)
	{
	}